

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_things.cpp
# Opt level: O3

void swrenderer::R_AddSprites(sector_t_conflict *sec,int lightlevel,int fakeside)

{
  double *pdVar1;
  AActor *thing;
  extsector_t *peVar2;
  double *pdVar3;
  secplane_t *psVar4;
  int iVar5;
  undefined4 extraout_var;
  ulong uVar7;
  sector_t_conflict *fakeceiling;
  sector_t_conflict *fakefloor;
  long lVar8;
  sector_t_conflict *in_R8;
  sector_t_conflict *psVar9;
  msecnode_t *pmVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  PClass *pPVar6;
  
  pmVar10 = sec->touching_renderthings;
  if ((pmVar10 != (msecnode_t *)0x0) && (sec->validcount != validcount)) {
    sec->validcount = validcount;
    spriteshade = (lightlevel + r_actualextralight) * -0x4000 + 0x3d0000;
    do {
      thing = pmVar10->m_thing;
      if (thing->validcount != validcount) {
        thing->validcount = validcount;
        pPVar6 = (thing->super_DThinker).super_DObject.Class;
        if (pPVar6 == (PClass *)0x0) {
          iVar5 = (**(thing->super_DThinker).super_DObject._vptr_DObject)();
          pPVar6 = (PClass *)CONCAT44(extraout_var,iVar5);
          (thing->super_DThinker).super_DObject.Class = pPVar6;
        }
        lVar8 = *(long *)&pPVar6[1].super_PNativeStruct.super_PStruct.HasNativeFields;
        if (((lVar8 == 0) || (iVar5 = *(int *)(lVar8 + 0x28), iVar5 < 0)) ||
           (dVar11 = (thing->__Pos).X - ViewPos.X, dVar12 = (thing->__Pos).Y - ViewPos.Y,
           dVar13 = (thing->__Pos).Z - ViewPos.Z, dVar14 = (double)iVar5,
           dVar13 * dVar13 + dVar11 * dVar11 + dVar12 * dVar12 < dVar14 * dVar14)) {
          peVar2 = thing->Sector->e;
          uVar7 = (ulong)(peVar2->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
          if (uVar7 == 0) {
            fakefloor = (sector_t_conflict *)0x0;
            fakeceiling = (sector_t_conflict *)0x0;
          }
          else {
            lVar8 = 0;
            fakefloor = (sector_t_conflict *)0x0;
            psVar9 = (sector_t_conflict *)0x0;
            do {
              fakeceiling = *(sector_t_conflict **)
                             ((long)(peVar2->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.
                                    Array + lVar8);
              if (((~*(uint *)&fakeceiling->planes[1].xform.xOffs & 0xb) == 0) &&
                 (*(int *)((long)&fakeceiling->planes[1].xform.yScale + 4) == 0xff)) {
                if ((fakefloor == (sector_t_conflict *)0x0) &&
                   ((pdVar3 = (double *)fakeceiling->planes[0].xform.Angle.Degrees,
                    pdVar3[1] != 0.0 || *pdVar3 != 0.0 ||
                    (pdVar1 = &(thing->__Pos).Z, fakefloor = fakeceiling,
                    *pdVar1 <= pdVar3[4] * pdVar3[3] && pdVar3[4] * pdVar3[3] != *pdVar1)))) {
                  fakefloor = (sector_t_conflict *)0x0;
                }
                psVar4 = (secplane_t *)fakeceiling->planes[0].xform.xOffs;
                if (((psVar4->normal).Y != 0.0 || (psVar4->normal).X != 0.0) ||
                   (psVar4->negiC * psVar4->D < thing->Height + (thing->__Pos).Z))
                goto LAB_002eef74;
              }
              else {
LAB_002eef74:
                fakeceiling = psVar9;
              }
              lVar8 = lVar8 + 8;
              psVar9 = fakeceiling;
              in_R8 = fakeceiling;
            } while (uVar7 << 3 != lVar8);
          }
          R_ProjectSprite(thing,fakeside,(F3DFloor *)fakefloor,(F3DFloor *)fakeceiling,in_R8);
        }
      }
      pmVar10 = pmVar10->m_snext;
    } while (pmVar10 != (msecnode_t *)0x0);
  }
  return;
}

Assistant:

void R_AddSprites (sector_t *sec, int lightlevel, int fakeside)
{
	F3DFloor *fakeceiling = NULL;
	F3DFloor *fakefloor = NULL;

	// BSP is traversed by subsector.
	// A sector might have been split into several
	//	subsectors during BSP building.
	// Thus we check whether it was already added.
	if (sec->touching_renderthings == nullptr || sec->validcount == validcount)
		return;

	// Well, now it will be done.
	sec->validcount = validcount;

	spriteshade = LIGHT2SHADE(lightlevel + r_actualextralight);

	// Handle all things in sector.
	for(auto p = sec->touching_renderthings; p != nullptr; p = p->m_snext)
	{
		auto thing = p->m_thing;
		if (thing->validcount == validcount) continue;
		thing->validcount = validcount;
		
		FIntCVar *cvar = thing->GetClass()->distancecheck;
		if (cvar != NULL && *cvar >= 0)
		{
			double dist = (thing->Pos() - ViewPos).LengthSquared();
			double check = (double)**cvar;
			if (dist >= check * check)
			{
				continue;
			}
		}

		// find fake level
		for(auto rover : thing->Sector->e->XFloor.ffloors) 
		{
			if(!(rover->flags & FF_EXISTS) || !(rover->flags & FF_RENDERPLANES)) continue;
			if(!(rover->flags & FF_SOLID) || rover->alpha != 255) continue;
			if(!fakefloor)
			{
				if(!rover->top.plane->isSlope())
				{
					if(rover->top.plane->ZatPoint(0., 0.) <= thing->Z()) fakefloor = rover;
				}
			}
			if(!rover->bottom.plane->isSlope())
			{
				if(rover->bottom.plane->ZatPoint(0., 0.) >= thing->Top()) fakeceiling = rover;
			}
		}	
		R_ProjectSprite (thing, fakeside, fakefloor, fakeceiling, sec);
		fakeceiling = NULL;
		fakefloor = NULL;
	}
}